

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.cxx
# Opt level: O2

void __thiscall
nuraft::peer::send_req(peer *this,ptr<peer> *myself,ptr<req_msg> *req,rpc_handler *handler)

{
  int32 iVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  int iVar6;
  msg_type type;
  ptr<rpc_client> rpc_local;
  rpc_handler h;
  ptr<rpc_result> pending;
  _Bind<void_(nuraft::peer::*(nuraft::peer_*,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>_&,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>_&,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
  local_a0;
  peer *local_48;
  code *local_40;
  undefined8 local_38;
  
  if (((this->abandoned_)._M_base._M_i & 1U) == 0) {
    if (((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
         (element_type *)0x0) &&
       (peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar3 != (element_type *)0x0)) {
      iVar6 = (*peVar3->_vptr_logger[7])();
      if (5 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        peVar4 = (req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        iVar1 = (peVar4->super_msg_base).src_;
        uVar2 = (peVar4->super_msg_base).dst_;
        msg_type_to_string_abi_cxx11_
                  ((string *)&h,(nuraft *)(ulong)(peVar4->super_msg_base).type_,type);
        msg_if_given_abi_cxx11_
                  ((string *)&local_a0,"send req %d -> %d, type %s",iVar1,(ulong)uVar2,
                   h.super__Function_base._M_functor._M_unused._M_object);
        (*peVar3->_vptr_logger[8])
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"send_req",0x2c,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&h);
      }
    }
    std::
    make_shared<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
              ((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
                *)&pending);
    rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::mutex::lock(&this->rpc_protector_);
    peVar5 = (this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar5 == (element_type *)0x0) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar3 != (element_type *)0x0) {
        iVar6 = (*peVar3->_vptr_logger[7])();
        if (5 < iVar6) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_((string *)&local_a0,"rpc local is null");
          (*peVar3->_vptr_logger[8])
                    (peVar3,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                     ,"send_req",0x35,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      LOCK();
      (this->busy_flag_)._M_base._M_i = false;
      UNLOCK();
    }
    else {
      std::__shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>,
                 &(this->rpc_).super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->rpc_protector_);
    if (peVar5 != (element_type *)0x0) {
      local_40 = handle_rpc_result;
      local_38 = 0;
      local_48 = this;
      std::
      _Bind<void(nuraft::peer::*(nuraft::peer*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
      ::
      _Bind<nuraft::peer*,std::shared_ptr<nuraft::peer>&,std::shared_ptr<nuraft::rpc_client>&,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
                ((_Bind<void(nuraft::peer::*(nuraft::peer*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&local_a0,(offset_in_peer_to_subr *)&local_40,&local_48,myself,&rpc_local,req,
                 (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>
                  *)&pending,(_Placeholder<1> *)&std::placeholders::_1,
                 (_Placeholder<2> *)&std::placeholders::_2);
      std::
      function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>::
      function<std::_Bind<void(nuraft::peer::*(nuraft::peer*,std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::peer>,std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::req_msg>&,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,std::shared_ptr<nuraft::rpc_exception>>>&,std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,void>
                ((function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>
                  *)&h,&local_a0);
      std::
      _Tuple_impl<1UL,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
      ::~_Tuple_impl((_Tuple_impl<1UL,_std::shared_ptr<nuraft::peer>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>_>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                      *)&local_a0._M_bound_args);
      if (rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        (*(rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_rpc_client[2])
                  (rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,req,&h,0);
      }
      std::_Function_base::~_Function_base(&h.super__Function_base);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rpc_local.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pending.
                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::resp_msg>,_std::shared_ptr<nuraft::rpc_exception>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 != (element_type *)0x0) {
      iVar6 = (*peVar3->_vptr_logger[7])();
      if (1 < iVar6) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)&local_a0,"peer %d has been shut down, cannot send request",
                   (ulong)(uint)((this->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar3->_vptr_logger[8])
                  (peVar3,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/peer.cxx"
                   ,"send_req",0x24,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
    }
  }
  return;
}

Assistant:

void peer::send_req( ptr<peer> myself,
                     ptr<req_msg>& req,
                     rpc_handler& handler )
{
    if (abandoned_) {
        p_er("peer %d has been shut down, cannot send request",
             config_->get_id());
        return;
    }

    if (req) {
        p_tr("send req %d -> %d, type %s",
             req->get_src(),
             req->get_dst(),
             msg_type_to_string( req->get_type() ).c_str() );
    }

    ptr<rpc_result> pending = cs_new<rpc_result>(handler);
    ptr<rpc_client> rpc_local = nullptr;
    {   std::lock_guard<std::mutex> l(rpc_protector_);
        if (!rpc_) {
            // Nothing will be sent, immediately free it
            // to serve next operation.
            p_tr("rpc local is null");
            set_free();
            return;
        }
        rpc_local = rpc_;
    }
    rpc_handler h = (rpc_handler)std::bind
                    ( &peer::handle_rpc_result,
                      this,
                      myself,
                      rpc_local,
                      req,
                      pending,
                      std::placeholders::_1,
                      std::placeholders::_2 );
    if (rpc_local) {
        rpc_local->send(req, h);
    }
}